

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::ctx::~ctx(ctx *this)

{
  ulong uVar1;
  ctx *this_local;
  
  uVar1 = std::uncaught_exception();
  if ((uVar1 & 1) == 0) {
    env::pop(this->environment);
  }
  return;
}

Assistant:

~ctx()
    {
#if lest_CPP17_OR_GREATER
        if ( std::uncaught_exceptions() == 0 )
#else
        if ( ! std::uncaught_exception() )
#endif
        {
            environment.pop();
        }
    }